

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O1

void __thiscall IContactList::RemoveContact(IContactList *this,char *pName,char *pClan)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  
  uVar1 = str_quickhash(pName);
  uVar2 = str_quickhash(pClan);
  if (0 < (long)this->m_NumContacts) {
    puVar3 = &this->m_aContacts[0].m_ClanHash;
    lVar4 = 0;
    do {
      if ((puVar3[-1] == uVar1) && (*puVar3 == uVar2)) {
        RemoveContact(this,(int)lVar4);
        return;
      }
      lVar4 = lVar4 + 1;
      puVar3 = puVar3 + 0x1f;
    } while (this->m_NumContacts != lVar4);
  }
  return;
}

Assistant:

void IContactList::RemoveContact(const char *pName, const char *pClan)
{
	unsigned NameHash = str_quickhash(pName);
	unsigned ClanHash = str_quickhash(pClan);
	for(int i = 0; i < m_NumContacts; ++i)
	{
		if(m_aContacts[i].m_NameHash == NameHash && m_aContacts[i].m_ClanHash == ClanHash)
		{
			RemoveContact(i);
			return;
		}
	}
}